

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil_rand.c
# Opt level: O3

void evutil_secure_rng_add_bytes(char *buf,size_t n)

{
  uchar uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar8 = 0x7fffffff;
  if (n < 0x7fffffff) {
    uVar8 = n;
  }
  if (arc4rand_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,arc4rand_lock);
  }
  if (rs_initialized == '\0') {
    arc4_stir();
  }
  if (n != 0) {
    uVar5 = 0;
    uVar7 = (uint)rs.j;
    uVar2 = (uint)(byte)(rs.i - 1);
    do {
      uVar3 = uVar2;
      uVar6 = (ulong)uVar7;
      iVar4 = 0;
      do {
        uVar7 = (uVar3 + 1 & 0xff) + iVar4 & 0xff;
        uVar1 = rs.s[uVar7];
        uVar6 = (ulong)(byte)((char)uVar6 + uVar1 +
                             buf[((long)iVar4 % (long)((int)uVar8 - (int)uVar5) & 0xffffffffU) +
                                 uVar5]);
        rs.s[uVar7] = rs.s[uVar6];
        rs.s[uVar6] = uVar1;
        iVar4 = iVar4 + 1;
      } while (iVar4 != 0x100);
      uVar5 = uVar5 + 0x100;
      uVar7 = uVar3;
      uVar2 = (uVar3 - 1 & 0xff) + 0x100;
    } while (uVar5 < uVar8);
    rs.i = (uchar)uVar3;
    rs.j = rs.i;
  }
  if (arc4rand_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,arc4rand_lock);
    return;
  }
  return;
}

Assistant:

void
evutil_secure_rng_add_bytes(const char *buf, size_t n)
{
	arc4random_addrandom((unsigned char*)buf,
	    n>(size_t)INT_MAX ? INT_MAX : (int)n);
}